

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

bool __thiscall absl::lts_20250127::Cord::Contains(Cord *this,Cord *rhs)

{
  bool bVar1;
  bool bVar2;
  CharIterator local_b0;
  
  bVar1 = empty(rhs);
  bVar2 = true;
  if (!bVar1) {
    Find(&local_b0,this,rhs);
    bVar2 = local_b0.chunk_iterator_.bytes_remaining_ != 0;
  }
  return bVar2;
}

Assistant:

bool Cord::Contains(const absl::Cord& rhs) const {
  return rhs.empty() || Find(rhs) != char_end();
}